

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

string * __thiscall
onmt::Tokenizer::detokenize_abi_cxx11_
          (string *__return_storage_ptr__,Tokenizer *this,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,Ranges *ranges,bool merge_ranges
          ,vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  Token *this_00;
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  iterator iVar4;
  size_type sVar5;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
  *this_01;
  bool bVar6;
  uint uVar7;
  int iVar8;
  pointer pTVar9;
  ulong uVar10;
  long lVar11;
  _Base_ptr p_Var12;
  string *psVar13;
  code_point_t uc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined7 in_register_00000081;
  iterator __begin2;
  ulong uVar15;
  unsigned_long *puVar16;
  int end;
  string prep_word;
  int start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> current_token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens_1;
  string c;
  size_t id;
  string code;
  int local_20c;
  string local_208;
  int local_1e4;
  string *local_1e0;
  unsigned_long *local_1d8;
  iterator iStack_1d0;
  unsigned_long *local_1c8;
  string local_1b8;
  Tokenizer *local_190;
  _Base_ptr local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [24];
  size_t local_158;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
  *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Head_base<0UL,_unsigned_long_&,_false> local_138;
  unsigned_long local_130;
  undefined4 local_124;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_120;
  string *local_118;
  string local_110;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_124 = (undefined4)CONCAT71(in_register_00000081,merge_ranges);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1e0 = __return_storage_ptr__;
  local_190 = this;
  local_120 = index_map;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  pTVar9 = (tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_188 = (_Base_ptr)tokens;
  local_150 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
               *)ranges;
  if ((tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    local_118 = &(local_190->_options).lang;
    do {
      this_00 = pTVar9 + (long)local_1b8._M_dataplus._M_p;
      if ((((local_1b8._M_dataplus._M_p != (pointer)0x0) &&
           ((local_190->_options).with_separators == false)) &&
          (pTVar9[(long)(local_1b8._M_dataplus._M_p + -1)].join_right == false)) &&
         (this_00->join_left == false)) {
        std::__cxx11::string::push_back((char)local_1e0);
      }
      pcVar1 = (this_00->surface)._M_dataplus._M_p;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar1,pcVar1 + (this_00->surface)._M_string_length);
      bVar6 = Token::is_placeholder(this_00);
      if (!bVar6) {
        if (Lowercase < this_00->casing) {
          restore_token_casing((string *)local_f0,&local_208,this_00->casing,local_118);
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
          }
        }
        uVar15 = 0;
        do {
          uVar10 = std::__cxx11::string::find
                             ((char *)&local_208,escaped_character_prefix_abi_cxx11_,uVar15);
          if ((uVar10 == 0xffffffffffffffff) ||
             (local_208._M_string_length < uVar10 + DAT_00388670 + 4)) {
            bVar6 = false;
          }
          else {
            iVar8 = 4;
            std::__cxx11::string::substr((ulong)local_f0,(ulong)&local_208);
            uVar7 = hex_to_int((string *)local_f0);
            unicode::cp_to_utf8_abi_cxx11_((string *)local_180,(unicode *)(ulong)uVar7,uc);
            bVar6 = true;
            if ((CONCAT44(local_180._12_4_,local_180._8_4_) == 0) ||
               (*(char *)local_180._0_8_ == '\0')) {
              bVar3 = false;
            }
            else {
              int_to_hex_abi_cxx11_(&local_110,(onmt *)(ulong)uVar7,4,iVar8);
              bVar3 = true;
              if (local_110._M_string_length == local_f0._8_8_) {
                if ((unsigned_long **)local_110._M_string_length == (unsigned_long **)0x0) {
                  bVar6 = false;
                }
                else {
                  iVar8 = bcmp(local_110._M_dataplus._M_p,(void *)local_f0._0_8_,
                               local_110._M_string_length);
                  bVar6 = iVar8 != 0;
                }
              }
              else {
                bVar6 = true;
              }
            }
            if ((bVar3) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2)) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            lVar11 = DAT_00388670;
            if (!bVar6) {
              std::__cxx11::string::replace
                        ((ulong)&local_208,uVar10,(char *)(DAT_00388670 + 4),local_180._0_8_);
              lVar11 = 1;
            }
            if ((string *)local_180._0_8_ != (string *)(local_180 + 0x10)) {
              operator_delete((void *)local_180._0_8_,local_170._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._0_8_ != &local_e0) {
              operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
            }
            uVar15 = lVar11 + uVar10;
            bVar6 = true;
          }
        } while (bVar6);
      }
      ranges = (Ranges *)local_150;
      if (local_208._M_string_length != 0) {
        if (local_150 !=
            (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
             *)0x0) {
          psVar13 = &local_1b8;
          if (local_120 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            puVar2 = (local_120->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((pointer)((long)(local_120->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <=
                local_1b8._M_dataplus._M_p) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            psVar13 = (string *)(puVar2 + (long)local_1b8._M_dataplus._M_p);
          }
          local_1d8 = (unsigned_long *)local_1e0->_M_string_length;
          local_148._M_allocated_capacity = (long)local_1d8 + (local_208._M_string_length - 1);
          local_f0._0_8_ = &local_148;
          local_f0._8_8_ = &local_1d8;
          local_180._0_8_ = psVar13;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<unsigned_long&&,unsigned_long&&>>
                    (local_150,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<const_unsigned_long_&> *)local_180,
                     (tuple<unsigned_long_&&,_unsigned_long_&&> *)local_f0);
        }
        std::__cxx11::string::_M_append((char *)local_1e0,(ulong)local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      local_1b8._M_dataplus._M_p = local_1b8._M_dataplus._M_p + 1;
      pTVar9 = (((_Vector_base<onmt::Token,_std::allocator<onmt::Token>_> *)&local_188->_M_color)->
               _M_impl).super__Vector_impl_data._M_start;
    } while (local_1b8._M_dataplus._M_p <
             (pointer)(((long)(((_Vector_base<onmt::Token,_std::allocator<onmt::Token>_> *)
                               &local_188->_M_color)->_M_impl).super__Vector_impl_data._M_finish -
                        (long)pTVar9 >> 3) * -0x71c71c71c71c71c7));
  }
  if (((byte)local_124 &
      (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
       *)ranges !=
      (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
       *)0x0) != 0) {
    paVar14 = &local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity =
         local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_208._M_dataplus._M_p = (pointer)paVar14;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    Tokenizer((Tokenizer *)local_f0,Conservative,0,&local_208,(string *)&joiner_marker_abi_cxx11_,
              &local_1b8,0x32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar14) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_170._8_8_ = local_180 + 8;
    local_180._8_4_ = _S_red;
    local_170._0_8_ = 0;
    local_158 = 0;
    local_1c8 = (unsigned_long *)0x0;
    local_1d8 = (unsigned_long *)0x0;
    iStack_1d0._M_current = (unsigned_long *)0x0;
    local_1e4 = 0;
    local_20c = -1;
    p_Var12 = *(_Base_ptr *)((long)ranges + 0x18);
    local_188 = (_Base_ptr)((long)ranges + 8);
    local_208._M_dataplus._M_p = (pointer)paVar14;
    local_170._16_8_ = local_170._8_8_;
    if (p_Var12 != local_188) {
      do {
        puVar16 = local_1d8;
        iVar4._M_current = iStack_1d0._M_current;
        if (local_20c + 1 == (int)p_Var12[1]._M_parent) {
          if (p_Var12 != *(_Base_ptr *)(local_150 + 0x18)) {
            lVar11 = std::_Rb_tree_decrement(p_Var12);
            std::__cxx11::string::assign
                      ((string *)&local_208,(ulong)local_1e0,*(ulong *)(lVar11 + 0x28));
            sVar5 = local_1b8._M_string_length;
            if ((pointer)local_1b8._M_string_length != local_1b8._M_dataplus._M_p) {
              local_190 = (Tokenizer *)local_1b8._M_dataplus._M_p;
              psVar13 = (string *)(local_1b8._M_dataplus._M_p + 0x10);
              do {
                if (psVar13 != (string *)*(undefined1 **)((long)(psVar13 + -1) + 0x10)) {
                  operator_delete(*(undefined1 **)((long)(psVar13 + -1) + 0x10),
                                  (ulong)((psVar13->_M_dataplus)._M_p + 1));
                }
                paVar14 = &psVar13->field_2;
                psVar13 = psVar13 + 1;
              } while (paVar14 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)sVar5);
              local_1b8._M_string_length = (size_type)local_190;
            }
            ITokenizer::tokenize
                      ((ITokenizer *)local_f0,&local_208,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1b8,true);
            puVar16 = local_1d8;
            iVar4._M_current = iStack_1d0._M_current;
            if (0x20 < local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p)
            goto LAB_001b39d0;
          }
        }
        else {
LAB_001b39d0:
          for (; puVar16 != iVar4._M_current; puVar16 = puVar16 + 1) {
            local_130 = *puVar16;
            local_138._M_head_impl = &local_130;
            local_148._M_allocated_capacity = (size_type)&local_20c;
            local_148._8_8_ = &local_1e4;
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
            ::
            _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                        *)local_180,(piecewise_construct_t *)&std::piecewise_construct,
                       (tuple<unsigned_long_&> *)&local_138,(tuple<int_&,_int_&> *)&local_148);
          }
          if (iStack_1d0._M_current != local_1d8) {
            iStack_1d0._M_current = local_1d8;
          }
          local_1e4 = *(int *)&p_Var12[1]._M_parent;
        }
        local_20c = *(int *)&p_Var12[1]._M_left;
        if (iStack_1d0._M_current == local_1c8) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,iStack_1d0,
                     (unsigned_long *)(p_Var12 + 1));
        }
        else {
          *iStack_1d0._M_current = *(unsigned_long *)(p_Var12 + 1);
          iStack_1d0._M_current = iStack_1d0._M_current + 1;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != local_188);
    }
    iVar4._M_current = iStack_1d0._M_current;
    if (local_1d8 != iStack_1d0._M_current) {
      puVar16 = local_1d8;
      do {
        local_130 = *puVar16;
        local_138._M_head_impl = &local_130;
        local_148._M_allocated_capacity = (size_type)&local_20c;
        local_148._8_8_ = &local_1e4;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
        ::
        _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                    *)local_180,(piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<unsigned_long_&> *)&local_138,(tuple<int_&,_int_&> *)&local_148);
        puVar16 = puVar16 + 1;
      } while (puVar16 != iVar4._M_current);
    }
    if (local_1d8 != (unsigned_long *)0x0) {
      operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
    }
    this_01 = local_150;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8);
    local_f0._0_8_ = &PTR__Tokenizer_00381050;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_allocated_capacity != &local_d0) {
      operator_delete((void *)local_e0._M_allocated_capacity,local_d0._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)this_01);
    if (local_170._0_8_ != 0) {
      *(undefined4 *)(this_01 + 8) = local_180._8_4_;
      *(undefined8 *)(this_01 + 0x10) = local_170._0_8_;
      *(undefined8 *)(this_01 + 0x18) = local_170._8_8_;
      *(undefined8 *)(this_01 + 0x20) = local_170._16_8_;
      *(_Base_ptr *)(local_170._0_8_ + 8) = local_188;
      *(size_t *)(this_01 + 0x28) = local_158;
      local_170._0_8_ = 0;
      local_170._8_8_ = local_180 + 8;
      local_158 = 0;
      local_170._16_8_ = local_170._8_8_;
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)local_180);
  }
  return local_1e0;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<Token>& tokens,
                                    Ranges* ranges,
                                    bool merge_ranges,
                                    const std::vector<size_t>* index_map) const
  {
    std::string line;
    line.reserve(tokens.size() * 10);

    for (size_t i = 0; i < tokens.size(); ++i)
    {
      const auto& token = tokens[i];
      if (!_options.with_separators && i > 0 && !tokens[i - 1].join_right && !token.join_left)
        line += ' ';

      std::string prep_word = token.surface;

      if (!token.is_placeholder())
      {
        if (token.casing != Casing::None && token.casing != Casing::Lowercase)
          prep_word = restore_token_casing(prep_word, token.casing, _options.lang);
        unescape_characters(prep_word);
      }

      if (!prep_word.empty())
      {
        if (ranges)
          ranges->emplace(std::piecewise_construct,
                          std::forward_as_tuple(index_map ? index_map->at(i) : i),
                          std::forward_as_tuple(line.size(), line.size() + prep_word.size() - 1));

        line.append(prep_word);
      }
    }

    if (ranges && merge_ranges)
      *ranges = merge_consecutive_ranges(line, *ranges);

    return line;
  }